

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h.h
# Opt level: O1

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZTriangle>::TPZNodeRep
          (TPZNodeRep<3,_pztopology::TPZTriangle> *this,TPZNodeRep<3,_pztopology::TPZTriangle> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  _Rb_tree_header *p_Var1;
  int64_t *__k;
  _Base_ptr p_Var2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  int64_t i;
  long lVar6;
  
  (this->super_TPZTriangle).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNodeRep_018b59d0;
  p_Var1 = &(gl2lcNdMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar6 = 0;
  while( true ) {
    __k = cp->fNodeIndexes + lVar6;
    p_Var4 = (gl2lcNdMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        if (*__k <= (long)*(size_t *)(p_Var4 + 1)) {
          p_Var2 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[(long)*(size_t *)(p_Var4 + 1) < *__k];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    p_Var5 = p_Var1;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
       (p_Var5 = (_Rb_tree_header *)p_Var2, *__k < (long)((_Rb_tree_header *)p_Var2)->_M_node_count)
       ) {
      p_Var5 = p_Var1;
    }
    if (p_Var5 == p_Var1) break;
    pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcNdMap,__k);
    this->fNodeIndexes[lVar6] = *pmVar3;
    lVar6 = lVar6 + 1;
    if (lVar6 == 3) {
      return;
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h.h",
             0x2c);
}

Assistant:

TPZNodeRep<N,Topology>::TPZNodeRep(const TPZNodeRep<N,Topology> &cp, std::map<int64_t,int64_t> & gl2lcNdMap)
    : TPZRegisterClassId(&TPZNodeRep::ClassId)
	{
		int64_t i;
		for(i = 0; i < N; i++)
		{
			if (gl2lcNdMap.find(cp.fNodeIndexes[i]) == gl2lcNdMap.end())
            {
#ifdef PZ_LOG
                TPZLogger loggernoderep("pz.geom.noderep");
                if (loggernoderep.isErrorEnabled()) {
                  std::stringstream sout;
                  sout << "ERROR in - " << __PRETTY_FUNCTION__
                       << " trying to clone a node " << i << " index "
                       << cp.fNodeIndexes[i] << " which is not mapped";
                  LOGPZ_ERROR(loggernoderep, sout.str().c_str());
                }                                
#endif
				DebugStop();
			}
			fNodeIndexes[i] = gl2lcNdMap [ cp.fNodeIndexes[i] ];
		}
	}